

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol.cpp
# Opt level: O3

void EBMOL::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Geometry *geom,Real dt,bool is_velocity,string redistribution_type)

{
  BoxArray *bxs;
  Box *pBVar1;
  EBCellFlagFab *pEVar2;
  string redistribution_type_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  FabType FVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  FabFactory<amrex::FArrayBox> *pFVar10;
  ulong uVar11;
  FabArray<amrex::EBCellFlagFab> *pFVar12;
  MultiCutFab *pMVar13;
  FabArray<amrex::FArrayBox> *pFVar14;
  Arena *arena;
  IntVect *pIVar15;
  Dim3 *pDVar16;
  undefined4 in_register_00000014;
  Array4<const_double> *srd_update_scale;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  undefined8 uVar29;
  int iVar31;
  int iVar32;
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  Periodicity PVar37;
  undefined8 in_stack_fffffffffffff488;
  ulong in_stack_fffffffffffff490;
  long local_b60;
  long local_b58;
  long local_b50;
  long local_b40;
  long local_b38;
  long local_b20;
  Array4<double> fy;
  FabArray<amrex::FArrayBox> *local_ab0;
  Box local_a84;
  Box result;
  int local_a3c;
  int iStack_a38;
  Array4<const_double> fcy;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fx;
  Vector<int,_std::allocator<int>_> *local_918;
  Array4<const_double> fcz;
  Array4<const_double> apx;
  Array4<double> zed;
  Array4<double> yed;
  long *local_7a8 [2];
  long local_798 [2];
  BoxArray *local_788;
  DistributionMapping *local_780;
  Real local_778;
  long local_770;
  long local_768;
  long local_760;
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  long local_738;
  long local_730;
  ulong local_728;
  long local_720;
  long local_718;
  Box local_70c;
  Box local_6f0;
  Box local_6d4;
  Array4<const_double> q;
  Array4<const_double> apy;
  Array4<const_double> uc;
  Array4<const_double> fcx_1;
  Array4<const_double> v;
  Array4<const_double> u;
  MFItInfo local_52c;
  Array4<const_double> vfrac;
  Array4<const_double> apz;
  Array4<const_double> ccc;
  Array4<double> advc_arr;
  Array4<const_double> wc;
  Array4<const_double> vc;
  MultiFab sstate_tmp;
  Array4<const_double> w;
  MultiFab advc;
  
  srd_update_scale = (Array4<const_double> *)CONCAT44(in_register_00000014,ncomp);
  local_778 = dt;
  if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < state_comp + ncomp) {
    amrex::Assert_host("state.nComp() >= state_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x152,(char *)0x0);
  }
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp <
      aofs_comp + (int)srd_update_scale) {
    amrex::Assert_host("aofs.nComp() >= aofs_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x153,(char *)0x0);
  }
  iVar17 = edge_comp + (int)srd_update_scale;
  if ((xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar17) {
    amrex::Assert_host("xedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x154,(char *)0x0);
  }
  if ((yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar17) {
    amrex::Assert_host("yedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x155,(char *)0x0);
  }
  if ((zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar17) {
    amrex::Assert_host("zedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x156,(char *)0x0);
  }
  iVar17 = fluxes_comp + (int)srd_update_scale;
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar17) {
    amrex::Assert_host("xfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x157,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar17) {
    amrex::Assert_host("yfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x158,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar17) {
    amrex::Assert_host("zfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x159,(char *)0x0);
  }
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("xfluxes.nGrow() == xedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15a,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("yfluxes.nGrow() == yedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15b,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("zfluxes.nGrow() == zedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15c,(char *)0x0);
  }
  if ((!known_edgestate) &&
     ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 2)) {
    amrex::Assert_host("state.nGrow() >= 2",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x161,(char *)0x0);
  }
  pFVar10 = (state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar10 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar9 = __dynamic_cast(pFVar10,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo), lVar9 == 0)) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x163,(char *)0x0);
    pFVar10 = (state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
              super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  }
  pFVar10 = (FabFactory<amrex::FArrayBox> *)
            __dynamic_cast(pFVar10,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pFVar10 == (FabFactory<amrex::FArrayBox> *)0x0) {
    __cxa_bad_cast();
  }
  bxs = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  local_780 = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._1_7_ = 0;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ = 1;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_12_ =
       SUB1612((undefined1  [16])0x0,4);
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_16_ =
       (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (&advc,bxs,local_780,(int)srd_update_scale,3,(MFInfo *)&sstate_tmp,pFVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0,0,
             advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  local_52c.num_streams = amrex::Gpu::Device::max_gpu_streams;
  local_52c.do_tiling = true;
  local_52c.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_52c.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_52c.tilesize.vect[2] = DAT_00810ec0;
  local_52c.dynamic = true;
  local_52c.device_sync = true;
  local_788 = bxs;
  amrex::MFIter::MFIter((MFIter *)&sstate_tmp,(FabArrayBase *)aofs,&local_52c);
  if (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[0] <
      sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[2]) {
    uVar5 = (uint)!known_edgestate;
    iVar17 = uVar5 * 2;
    uVar11 = (ulong)srd_update_scale & 0xffffffff;
    do {
      amrex::MFIter::tilebox(&local_a84,(MFIter *)&sstate_tmp);
      amrex::MFIter::nodaltilebox(&local_6d4,(MFIter *)&sstate_tmp,0);
      amrex::MFIter::nodaltilebox(&local_6f0,(MFIter *)&sstate_tmp,1);
      amrex::MFIter::nodaltilebox(&local_70c,(MFIter *)&sstate_tmp,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fx,&xfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fy,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fz,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&xed,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&yed,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&zed,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
      pFVar12 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
      pIVar15 = &sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                 m_bndryReg.m_loshft;
      if (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._52_8_
          != 0) {
        pIVar15 = (IntVect *)
                  ((long)sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op.m_bndryReg.m_loshft.vect[0] * 4 +
                  *(long *)sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                           m_bat.m_op._52_8_);
      }
      pEVar2 = (pFVar12->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[pIVar15->vect[0]];
      fcx_1.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
      fcx_1.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
      fcx_1.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      fcx_1.begin.x = (pBVar1->smallend).vect[0];
      fcx_1.begin.y = (pBVar1->smallend).vect[1];
      lVar9 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar20 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar23 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      fcx_1.jstride = (lVar20 - (pBVar1->smallend).vect[0]) + 1;
      fcx_1.kstride =
           (lVar9 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           fcx_1.jstride;
      fcx_1.nstride = (lVar23 - fcx_1.begin.z) * fcx_1.kstride;
      fcx_1.end._0_8_ = lVar20 + 1U & 0xffffffff | lVar9 << 0x20;
      fcx_1.end.z = (int)lVar23;
      FVar6 = amrex::EBCellFlagFab::getType(pEVar2,&local_a84);
      if (FVar6 == covered) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&uc,&aofs->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&sstate_tmp,aofs_comp);
        auVar4 = _DAT_0074fb40;
        auVar3 = _DAT_0074fb30;
        if (0 < (int)srd_update_scale) {
          local_758 = (long)fx.begin.x;
          local_760 = (long)fx.begin.y;
          local_b58 = (long)uc.p +
                      ((long)local_a84.smallend.vect[1] - (long)uc.begin.y) * uc.jstride * 8 +
                      (long)local_a84.smallend.vect[0] * 8 + (long)uc.begin.x * -8 + 8;
          uVar18 = local_a84.bigend.vect[0] - local_a84.smallend.vect[0];
          auVar35._4_4_ = 0;
          auVar35._0_4_ = uVar18;
          auVar35._8_4_ = uVar18;
          auVar35._12_4_ = 0;
          local_730 = uc.nstride * 8;
          local_718 = uc.kstride * 8;
          local_720 = -(long)uc.begin.z;
          auVar35 = auVar35 ^ _DAT_0074fb40;
          local_768 = (long)xed.begin.x;
          local_770 = (long)xed.begin.y;
          local_738 = (long)fy.begin.x;
          local_740 = (long)fy.begin.y;
          local_748 = (long)yed.begin.x;
          local_750 = (long)yed.begin.y;
          uVar25 = 0;
          do {
            local_728 = uVar25;
            iVar7 = local_a84.smallend.vect[2];
            if (local_a84.smallend.vect[2] <= local_a84.bigend.vect[2]) {
              do {
                if (local_a84.smallend.vect[1] <= local_a84.bigend.vect[1]) {
                  lVar20 = (iVar7 + local_720) * local_718 + local_b58;
                  lVar9 = (long)local_a84.smallend.vect[1];
                  do {
                    if (local_a84.smallend.vect[0] <= local_a84.bigend.vect[0]) {
                      uVar25 = 0;
                      do {
                        auVar33._8_4_ = (int)uVar25;
                        auVar33._0_8_ = uVar25;
                        auVar33._12_4_ = (int)(uVar25 >> 0x20);
                        auVar33 = (auVar33 | auVar3) ^ auVar4;
                        bVar28 = auVar35._0_4_ < auVar33._0_4_;
                        iVar31 = auVar35._4_4_;
                        iVar8 = auVar33._4_4_;
                        if ((bool)(~(iVar31 < iVar8 || iVar8 == iVar31 && bVar28) & 1)) {
                          *(undefined8 *)(lVar20 + -8 + uVar25 * 8) = 0x483d6329f1c35ca5;
                        }
                        if (iVar31 >= iVar8 && (iVar8 != iVar31 || !bVar28)) {
                          *(undefined8 *)(lVar20 + uVar25 * 8) = 0x483d6329f1c35ca5;
                        }
                        uVar25 = uVar25 + 2;
                      } while (((ulong)uVar18 + 2 & 0x1fffffffe) != uVar25);
                    }
                    lVar9 = lVar9 + 1;
                    lVar20 = lVar20 + uc.jstride * 8;
                  } while (local_a84.bigend.vect[1] + 1 != (int)lVar9);
                }
                bVar28 = iVar7 != local_a84.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar28);
            }
            local_b58 = local_b58 + local_730;
            uVar25 = local_728 + 1;
          } while (local_728 + 1 != uVar11);
          lVar9 = (long)local_6d4.smallend.vect[1];
          local_b50 = (long)xed.p +
                      (lVar9 - local_770) * xed.jstride * 8 + (long)local_6d4.smallend.vect[0] * 8 +
                      local_768 * -8;
          local_b20 = (long)fx.p +
                      (lVar9 - local_760) * fx.jstride * 8 + (long)local_6d4.smallend.vect[0] * 8 +
                      local_758 * -8;
          uVar25 = 0;
          do {
            iVar7 = local_6d4.smallend.vect[2];
            if (local_6d4.smallend.vect[2] <= local_6d4.bigend.vect[2]) {
              do {
                if (local_6d4.smallend.vect[1] <= local_6d4.bigend.vect[1]) {
                  lVar19 = ((long)iVar7 - (long)xed.begin.z) * xed.kstride * 8 + local_b50;
                  lVar23 = ((long)iVar7 - (long)fx.begin.z) * fx.kstride * 8 + local_b20;
                  lVar20 = lVar9;
                  do {
                    if (local_6d4.smallend.vect[0] <= local_6d4.bigend.vect[0]) {
                      lVar21 = 0;
                      do {
                        *(undefined8 *)(lVar23 + lVar21 * 8) = 0;
                        *(undefined8 *)(lVar19 + lVar21 * 8) = 0x483d6329f1c35ca5;
                        lVar21 = lVar21 + 1;
                      } while ((local_6d4.bigend.vect[0] - local_6d4.smallend.vect[0]) + 1 !=
                               (int)lVar21);
                    }
                    lVar20 = lVar20 + 1;
                    lVar19 = lVar19 + xed.jstride * 8;
                    lVar23 = lVar23 + fx.jstride * 8;
                  } while (local_6d4.bigend.vect[1] + 1 != (int)lVar20);
                }
                bVar28 = iVar7 != local_6d4.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar28);
            }
            uVar25 = uVar25 + 1;
            local_b50 = local_b50 + xed.nstride * 8;
            local_b20 = local_b20 + fx.nstride * 8;
          } while (uVar25 != uVar11);
          lVar20 = (long)local_6f0.smallend.vect[1];
          local_b40 = (long)yed.p +
                      (lVar20 - local_750) * yed.jstride * 8 + (long)local_6f0.smallend.vect[0] * 8
                      + local_748 * -8;
          lVar9 = CONCAT44(fy.jstride._4_4_,(int)fy.jstride) * 8;
          local_b38 = (long)fy.p +
                      (lVar20 - local_740) * lVar9 + (long)local_6f0.smallend.vect[0] * 8 +
                      local_738 * -8;
          uVar25 = 0;
          do {
            in_stack_fffffffffffff490 = uVar25;
            iVar7 = local_6f0.smallend.vect[2];
            if (local_6f0.smallend.vect[2] <= local_6f0.bigend.vect[2]) {
              do {
                if (local_6f0.smallend.vect[1] <= local_6f0.bigend.vect[1]) {
                  lVar21 = ((long)iVar7 - (long)yed.begin.z) * yed.kstride * 8 + local_b40;
                  lVar19 = ((long)iVar7 - (long)fy.begin.z) *
                           CONCAT44(fy.kstride._4_4_,(int)fy.kstride) * 8 + local_b38;
                  lVar23 = lVar20;
                  do {
                    if (local_6f0.smallend.vect[0] <= local_6f0.bigend.vect[0]) {
                      lVar27 = 0;
                      do {
                        *(undefined8 *)(lVar19 + lVar27 * 8) = 0;
                        *(undefined8 *)(lVar21 + lVar27 * 8) = 0x483d6329f1c35ca5;
                        lVar27 = lVar27 + 1;
                      } while ((local_6f0.bigend.vect[0] - local_6f0.smallend.vect[0]) + 1 !=
                               (int)lVar27);
                    }
                    lVar23 = lVar23 + 1;
                    lVar21 = lVar21 + yed.jstride * 8;
                    lVar19 = lVar19 + lVar9;
                  } while (local_6f0.bigend.vect[1] + 1 != (int)lVar23);
                }
                bVar28 = iVar7 != local_6f0.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar28);
            }
            local_b40 = local_b40 + yed.nstride * 8;
            local_b38 = local_b38 + CONCAT44(fy.nstride._4_4_,(uint)fy.nstride) * 8;
            uVar25 = in_stack_fffffffffffff490 + 1;
          } while (in_stack_fffffffffffff490 + 1 != uVar11);
        }
        if (0 < (int)srd_update_scale) {
          lVar9 = (long)local_70c.smallend.vect[1];
          in_stack_fffffffffffff490 =
               (lVar9 - zed.begin.y) * zed.jstride * 8 + (long)local_70c.smallend.vect[0] * 8 +
               (long)zed.begin.x * -8 + (long)zed.p;
          local_b60 = (lVar9 - fz.begin.y) * fz.jstride * 8 + (long)local_70c.smallend.vect[0] * 8 +
                      (long)fz.begin.x * -8 + (long)fz.p;
          uVar25 = 0;
          do {
            iVar7 = local_70c.smallend.vect[2];
            if (local_70c.smallend.vect[2] <= local_70c.bigend.vect[2]) {
              do {
                if (local_70c.smallend.vect[1] <= local_70c.bigend.vect[1]) {
                  lVar23 = ((long)iVar7 - (long)zed.begin.z) * zed.kstride * 8 +
                           in_stack_fffffffffffff490;
                  lVar19 = ((long)iVar7 - (long)fz.begin.z) * fz.kstride * 8 + local_b60;
                  lVar20 = lVar9;
                  do {
                    if (local_70c.smallend.vect[0] <= local_70c.bigend.vect[0]) {
                      lVar21 = 0;
                      do {
                        *(undefined8 *)(lVar19 + lVar21 * 8) = 0;
                        *(undefined8 *)(lVar23 + lVar21 * 8) = 0x483d6329f1c35ca5;
                        lVar21 = lVar21 + 1;
                      } while ((local_70c.bigend.vect[0] - local_70c.smallend.vect[0]) + 1 !=
                               (int)lVar21);
                    }
                    lVar20 = lVar20 + 1;
                    lVar23 = lVar23 + zed.jstride * 8;
                    lVar19 = lVar19 + fz.jstride * 8;
                  } while (local_70c.bigend.vect[1] + 1 != (int)lVar20);
                }
                bVar28 = iVar7 != local_70c.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar28);
            }
            uVar25 = uVar25 + 1;
            in_stack_fffffffffffff490 = in_stack_fffffffffffff490 + zed.nstride * 8;
            local_b60 = local_b60 + fz.nstride * 8;
          } while (uVar25 != uVar11);
        }
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&uc,&ucorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&vc,&vcorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&wc,&wcorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        result.btype.itype = local_a84.btype.itype;
        result.smallend.vect[0] = local_a84.smallend.vect[0] + uVar5 * -2;
        result.smallend.vect[1] = local_a84.smallend.vect[1] + uVar5 * -2;
        result.smallend.vect[2] = local_a84.smallend.vect[2] + uVar5 * -2;
        result.bigend.vect[0] = local_a84.bigend.vect[0] + iVar17;
        result.bigend.vect[1] = local_a84.bigend.vect[1] + iVar17;
        result.bigend.vect[2] = local_a84.bigend.vect[2] + iVar17;
        FVar6 = amrex::EBCellFlagFab::getType(pEVar2,&result);
        if (FVar6 == regular) {
          if (!known_edgestate) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)&result,&state->super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&sstate_tmp,state_comp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&fcy,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&fcz,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&ccc,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            MOL::ComputeEdgeState
                      (&local_a84,&xed,&yed,&zed,(Array4<const_double> *)&result,
                       (int)srd_update_scale,&fcy,&fcz,&ccc,&geom->domain,bcs,d_bcrec_ptr,
                       is_velocity);
          }
          result.smallend.vect[0] = (int)xed.p;
          result.smallend.vect[1] = (int)((ulong)xed.p >> 0x20);
          result.smallend.vect[2] = (int)xed.jstride;
          result.bigend.vect[0] = (int)((ulong)xed.jstride >> 0x20);
          result.bigend.vect[1] = (int)xed.kstride;
          result.bigend.vect[2] = (int)((ulong)xed.kstride >> 0x20);
          result.btype.itype = (uint)xed.nstride;
          fcy.p = yed.p;
          fcy.jstride = yed.jstride;
          fcy.kstride = yed.kstride;
          fcy.nstride = yed.nstride;
          fcy.begin.z = yed.begin.z;
          fcy.end.z = yed.end.z;
          fcy.end.x = yed.end.x;
          fcy.end.y = yed.end.y;
          fcy.ncomp = yed.ncomp;
          fcz.p = zed.p;
          fcz.jstride = zed.jstride;
          fcz.kstride = zed.kstride;
          fcz.nstride = zed.nstride;
          fcz.begin.z = zed.begin.z;
          fcz.end.z = zed.end.z;
          fcz.end.x = zed.end.x;
          fcz.end.y = zed.end.y;
          fcz.ncomp = zed.ncomp;
          HydroUtils::ComputeFluxes
                    (&local_a84,&fx,&fy,&fz,&uc,&vc,&wc,(Array4<const_double> *)&result,&fcy,&fcz,
                     geom,(int)srd_update_scale,true);
          result.smallend.vect[0] = (int)fx.p;
          result.smallend.vect[1] = (int)((ulong)fx.p >> 0x20);
          result.smallend.vect[2] = (int)fx.jstride;
          result.bigend.vect[0] = fx.jstride._4_4_;
          result.bigend.vect[1] = (int)fx.kstride;
          result.bigend.vect[2] = fx.kstride._4_4_;
          result.btype.itype = fx.nstride._0_4_;
          fcy.p = fy.p;
          fcy.jstride = CONCAT44(fy.jstride._4_4_,(int)fy.jstride);
          fcy.kstride = CONCAT44(fy.kstride._4_4_,(int)fy.kstride);
          fcy.nstride = CONCAT44(fy.nstride._4_4_,(uint)fy.nstride);
          fcy.begin.z = fy.begin.z;
          fcy.end.z = fy.end.z;
          fcy.end.y = fy.end.y;
          fcy.end.x = fy.end.x;
          fcy.ncomp = fy.ncomp;
          fcz.p = fz.p;
          fcz.jstride = fz.jstride;
          fcz.kstride = fz.kstride;
          fcz.nstride = fz.nstride;
          fcz.begin.z = fz.begin.z;
          fcz.begin.x = fz.begin.x;
          fcz.begin.y = fz.begin.y;
          fcz.end.z = fz.end.z;
          fcz.end.x = fz.end.x;
          fcz.end.y = fz.end.y;
          fcz.ncomp = fz.ncomp;
          HydroUtils::ComputeDivergence
                    (&local_a84,&advc_arr,(Array4<const_double> *)&result,&fcy,&fcz,
                     (int)srd_update_scale,geom,-1.0,true);
        }
        else {
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&result,(MultiCutFab *)fcy.p,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcy,(MultiCutFab *)fcz.jstride,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcz,(MultiCutFab *)ccc.kstride,(MFIter *)&sstate_tmp);
          pMVar13 = amrex::EBDataCollection::getCentroid
                              ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&ccc,pMVar13,(MFIter *)&sstate_tmp);
          pFVar14 = &amrex::EBDataCollection::getVolFrac
                               ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory)->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&vfrac,pFVar14,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)apy.p,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apy,(MultiCutFab *)apz.jstride,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apz,(MultiCutFab *)q.kstride,(MFIter *)&sstate_tmp);
          if (!known_edgestate) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&q,&state->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,state_comp)
            ;
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&u,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&v,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&w,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            ComputeEdgeState(&local_a84,&xed,&yed,&zed,&q,(int)srd_update_scale,&u,&v,&w,
                             &geom->domain,bcs,d_bcrec_ptr,(Array4<const_double> *)&result,&fcy,&fcz
                             ,&ccc,&vfrac,(Array4<const_amrex::EBCellFlag> *)&fcx_1,is_velocity);
          }
          q.p = xed.p;
          q.jstride = xed.jstride;
          q.kstride = xed.kstride;
          q.nstride = xed.nstride;
          q.begin.z = xed.begin.z;
          q.end.z = xed.end.z;
          q.end.x = xed.end.x;
          q.end.y = xed.end.y;
          q.ncomp = xed.ncomp;
          u.p = yed.p;
          u.jstride = yed.jstride;
          u.kstride = yed.kstride;
          u.nstride = yed.nstride;
          u.begin.z = yed.begin.z;
          u.end.z = yed.end.z;
          u.end.x = yed.end.x;
          u.end.y = yed.end.y;
          u.ncomp = yed.ncomp;
          v.p = zed.p;
          v.jstride = zed.jstride;
          v.kstride = zed.kstride;
          v.nstride = zed.nstride;
          v.begin.z = zed.begin.z;
          v.end.z = zed.end.z;
          v.end.x = zed.end.x;
          v.end.y = zed.end.y;
          v.ncomp = zed.ncomp;
          HydroUtils::EB_ComputeFluxes
                    (&local_a84,&fx,&fy,&fz,&uc,&vc,&wc,&q,&u,&v,&apx,&apy,&apz,geom,
                     (int)srd_update_scale,(Array4<const_amrex::EBCellFlag> *)&fcx_1,true);
          auVar3 = (undefined1  [16])fx._24_16_;
          q.p = fx.p;
          q.jstride = fx.jstride;
          q.kstride = fx.kstride;
          q.nstride = fx.nstride;
          q.begin.z = fx.begin.z;
          q.begin.x = fx.begin.x;
          q.begin.y = fx.begin.y;
          q.end.z = fx.end.z;
          q.end.x = fx.end.x;
          q.end.y = fx.end.y;
          q.ncomp = fx.ncomp;
          u.p = fy.p;
          u.begin.z = fy.begin.z;
          u.end.z = fy.end.z;
          u.ncomp = fy.ncomp;
          v.p = fz.p;
          v.jstride = fz.jstride;
          v.kstride = fz.kstride;
          v.nstride = fz.nstride;
          v.begin.z = fz.begin.z;
          v.begin.x = fz.begin.x;
          v.begin.y = fz.begin.y;
          v.end.z = fz.end.z;
          v.end.x = fz.end.x;
          v.end.y = fz.end.y;
          v.ncomp = fz.ncomp;
          fx._24_16_ = auVar3;
          HydroUtils::EB_ComputeDivergence
                    (&local_a84,&advc_arr,&q,&u,&v,&vfrac,(int)srd_update_scale,geom,-1.0,true);
        }
      }
      amrex::MFIter::operator++((MFIter *)&sstate_tmp);
    } while (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
             m_bndryReg.m_loshft.vect[0] <
             sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
             m_bndryReg.m_loshft.vect[2]);
  }
  amrex::MFIter::~MFIter((MFIter *)&sstate_tmp);
  PVar37 = amrex::Geometry::periodicity(geom);
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ =
       (undefined1)PVar37.period.vect[0];
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._1_7_ =
       PVar37.period.vect._1_7_;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       PVar37.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&sstate_tmp,false);
  amrex::MultiFab::MultiFab(&sstate_tmp);
  iVar17 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
  local_ab0 = &aofs->super_FabArray<amrex::FArrayBox>;
  if (iVar17 == 0) {
    fx.p = (double *)0x1;
    fx.jstride = 0;
    fx.kstride = 0;
    fx.nstride = 0;
    fx.begin.x = 0;
    fx.begin.y = 0;
    local_ab0 = &sstate_tmp.super_FabArray<amrex::FArrayBox>;
    amrex::MultiFab::define
              ((MultiFab *)local_ab0,local_788,local_780,(int)srd_update_scale,
               (state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],
               (MFInfo *)&fx,pFVar10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fx.kstride);
    amrex::MultiFab::Copy
              ((MultiFab *)local_ab0,aofs,aofs_comp,0,(int)srd_update_scale,
               (state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  }
  local_52c.do_tiling = true;
  local_52c.tilesize.vect[2] = DAT_00810ec0;
  local_52c.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_52c.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_52c.dynamic = true;
  amrex::MFIter::MFIter((MFIter *)&fx,(FabArrayBase *)aofs,&local_52c);
  if (fx.begin.x < fx.begin.z) {
    iVar17 = (int)srd_update_scale;
    uVar11 = (ulong)srd_update_scale & 0xffffffff;
    do {
      amrex::MFIter::tilebox((Box *)&apx,(MFIter *)&fx);
      pFVar12 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
      pDVar16 = &fx.begin;
      if (local_918 != (Vector<int,_std::allocator<int>_> *)0x0) {
        pDVar16 = (Dim3 *)((local_918->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + fx.begin.x);
      }
      pEVar2 = (pFVar12->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[pDVar16->x];
      fz.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
      fz.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
      fz.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      fz.begin.x = (pBVar1->smallend).vect[0];
      fz.begin.y = (pBVar1->smallend).vect[1];
      lVar9 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar20 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar23 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      fz.jstride = (lVar20 - (pBVar1->smallend).vect[0]) + 1;
      fz.kstride = (lVar9 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
                   fz.jstride;
      fz.nstride = (lVar23 - fz.begin.z) * fz.kstride;
      fz.end._0_8_ = lVar20 + 1U & 0xffffffff | lVar9 << 0x20;
      fz.end.z = (int)lVar23;
      FVar6 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&apx);
      if (FVar6 != covered) {
        fy.nstride._0_4_ = (uint)apx.nstride;
        fy.jstride._0_4_ = (int)apx.jstride + -4;
        fy.jstride._4_4_ = apx.jstride._4_4_ + 4;
        fy.p = (double *)CONCAT44(apx.p._4_4_ + -4,(int)apx.p + -4);
        fy.kstride._0_4_ = (int)apx.kstride + 4;
        fy.kstride._4_4_ = apx.kstride._4_4_ + 4;
        FVar6 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&fy);
        if (FVar6 == regular) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&fy,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&fx,aofs_comp);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&xed,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&fx);
          if (0 < (int)srd_update_scale) {
            lVar20 = (long)apx.p._4_4_;
            lVar9 = CONCAT44(fy.jstride._4_4_,(int)fy.jstride) * 8;
            in_stack_fffffffffffff490 =
                 (lVar20 - fy.begin.y) * lVar9 + (long)(int)apx.p * 8 + (long)fy.begin.x * -8 +
                 (long)fy.p;
            lVar23 = (lVar20 - xed.begin.y) * xed.jstride * 8 + (long)(int)apx.p * 8 +
                     (long)xed.begin.x * -8 + (long)xed.p;
            uVar25 = 0;
            do {
              iVar7 = (int)apx.jstride;
              if ((int)apx.jstride <= apx.kstride._4_4_) {
                do {
                  if (apx.p._4_4_ <= (int)apx.kstride) {
                    lVar27 = ((long)iVar7 - (long)fy.begin.z) *
                             CONCAT44(fy.kstride._4_4_,(int)fy.kstride) * 8 +
                             in_stack_fffffffffffff490;
                    lVar21 = ((long)iVar7 - (long)xed.begin.z) * xed.kstride * 8 + lVar23;
                    lVar19 = lVar20;
                    do {
                      if ((int)apx.p <= apx.jstride._4_4_) {
                        lVar26 = 0;
                        do {
                          *(double *)(lVar27 + lVar26 * 8) =
                               *(double *)(lVar27 + lVar26 * 8) - *(double *)(lVar21 + lVar26 * 8);
                          lVar26 = lVar26 + 1;
                        } while ((apx.jstride._4_4_ - (int)apx.p) + 1 != (int)lVar26);
                      }
                      lVar19 = lVar19 + 1;
                      lVar27 = lVar27 + lVar9;
                      lVar21 = lVar21 + xed.jstride * 8;
                    } while ((int)apx.kstride + 1 != (int)lVar19);
                  }
                  bVar28 = iVar7 != apx.kstride._4_4_;
                  iVar7 = iVar7 + 1;
                } while (bVar28);
              }
              uVar25 = uVar25 + 1;
              in_stack_fffffffffffff490 =
                   in_stack_fffffffffffff490 + CONCAT44(fy.nstride._4_4_,(uint)fy.nstride) * 8;
              lVar23 = lVar23 + xed.nstride * 8;
            } while (uVar25 != uVar11);
          }
        }
        else {
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&xed,(MultiCutFab *)fy.p,(MFIter *)&fx);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&yed,
                     (MultiCutFab *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride),(MFIter *)&fx);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&zed,
                     (MultiCutFab *)CONCAT44(fy.kstride._4_4_,(int)fy.kstride),(MFIter *)&fx);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcx_1,(MultiCutFab *)fy.p,(MFIter *)&fx);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    (&uc,(MultiCutFab *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride),(MFIter *)&fx);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    (&vc,(MultiCutFab *)CONCAT44(fy.kstride._4_4_,(int)fy.kstride),(MFIter *)&fx);
          pMVar13 = amrex::EBDataCollection::getCentroid
                              ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&wc,pMVar13,(MFIter *)&fx);
          pFVar14 = &amrex::EBDataCollection::getVolFrac
                               ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory)->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&advc_arr,pFVar14,(MFIter *)&fx);
          apy.p = (double *)CONCAT44(apx.p._4_4_,(int)apx.p);
          apy.nstride._0_4_ = (uint)apx.nstride;
          apy.kstride._4_4_ = apx.kstride._4_4_;
          apy.kstride._0_4_ = (int)apx.kstride;
          apy.jstride._0_4_ = (int)apx.jstride;
          apy.jstride._4_4_ = apx.jstride._4_4_;
          iVar7 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          if (iVar7 == 0) {
            iVar7 = (int)apy.p + -3;
            uVar29 = 0x3fffffffd;
LAB_00450792:
            iVar31 = (int)((ulong)uVar29 >> 0x20);
            apy.jstride._0_4_ = (int)apy.jstride + (int)uVar29;
            apy.jstride._4_4_ = apy.jstride._4_4_ + iVar31;
            apy.kstride._0_4_ = (int)apy.kstride + iVar31;
            apy.p = (double *)CONCAT44(apy.p._4_4_ + (int)uVar29,iVar7);
            apy.kstride._4_4_ = apy.kstride._4_4_ + iVar31;
          }
          else {
            iVar7 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
            if (iVar7 == 0) {
              iVar7 = (int)apy.p + -2;
              uVar29 = 0x2fffffffe;
              goto LAB_00450792;
            }
          }
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)&fy,(Box *)&apy,iVar17 * 2,true,false,(Arena *)0x0);
          arena = (Arena *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride);
          if (arena == (Arena *)0x0) {
            arena = amrex::The_Arena();
          }
          amrex::Gpu::Elixir::Elixir((Elixir *)&apz,(void *)0x0,arena);
          iVar31 = fy.begin.x;
          iVar7 = fy.nstride._4_4_;
          uVar5 = (uint)fy.nstride;
          lVar9 = (long)fy.begin.z;
          result._8_8_ = ((long)fy.begin.y - (long)(int)(uint)fy.nstride) + 1;
          local_a3c = fy.begin.y + 1;
          result.bigend.vect._4_8_ = ((lVar9 + 1) - (long)fy.nstride._4_4_) * result._8_8_;
          result.smallend.vect[0] = (int)fy.kstride;
          result.smallend.vect[1] = fy.kstride._4_4_;
          result.btype.itype =
               (uint)((((long)fy.end.x + 1) - (long)fy.begin.x) * result.bigend.vect._4_8_);
          iVar22 = (int)((long)fy.end.x + 1);
          iVar8 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          auVar4 = _DAT_0074fb40;
          auVar3 = _DAT_0074fb30;
          if ((iVar8 == 0) && (iVar31 < iVar22)) {
            iStack_a38 = (int)(lVar9 + 1);
            uVar18 = ~uVar5 + local_a3c;
            auVar30._4_4_ = 0;
            auVar30._0_4_ = uVar18;
            auVar30._8_4_ = uVar18;
            auVar30._12_4_ = 0;
            auVar30 = auVar30 ^ _DAT_0074fb40;
            iVar8 = iVar31;
            do {
              if (iVar7 < iStack_a38) {
                lVar9 = ((long)iVar8 - (long)iVar31) * result.bigend.vect._4_8_ * 8 +
                        CONCAT44(result.smallend.vect[1],result.smallend.vect[0]) + 8;
                iVar24 = iVar7;
                do {
                  if ((int)uVar5 < local_a3c) {
                    uVar25 = 0;
                    do {
                      auVar34._8_4_ = (int)uVar25;
                      auVar34._0_8_ = uVar25;
                      auVar34._12_4_ = (int)(uVar25 >> 0x20);
                      auVar35 = (auVar34 | auVar3) ^ auVar4;
                      bVar28 = auVar30._0_4_ < auVar35._0_4_;
                      iVar32 = auVar30._4_4_;
                      iVar36 = auVar35._4_4_;
                      if ((bool)(~(iVar32 < iVar36 || iVar36 == iVar32 && bVar28) & 1)) {
                        *(undefined8 *)(lVar9 + -8 + uVar25 * 8) = 0x3ff0000000000000;
                      }
                      if (iVar32 >= iVar36 && (iVar36 != iVar32 || !bVar28)) {
                        *(undefined8 *)(lVar9 + uVar25 * 8) = 0x3ff0000000000000;
                      }
                      uVar25 = uVar25 + 2;
                    } while (((ulong)uVar18 + 2 & 0x1fffffffe) != uVar25);
                  }
                  iVar24 = iVar24 + 1;
                  lVar9 = lVar9 + result._8_8_ * 8;
                } while (iStack_a38 != iVar24);
              }
              bVar28 = iVar8 != iVar22 + -1;
              iVar8 = iVar8 + 1;
            } while (bVar28);
          }
          fcy.begin.y = fy.nstride._4_4_;
          fcy.begin.x = (uint)fy.nstride;
          fcy.jstride = ((long)fy.begin.y - (long)(int)(uint)fy.nstride) + 1;
          fcy.kstride = (((long)fy.begin.z + 1) - (long)fy.nstride._4_4_) * fcy.jstride;
          fcy.nstride = (((long)fy.end.x + 1) - (long)fy.begin.x) * fcy.kstride;
          fcy.end._0_8_ = (long)fy.begin.y + 1U & 0xffffffff | (long)fy.begin.z + 1 << 0x20;
          fcy.p = (double *)(fcy.nstride * iVar17 * 8 + CONCAT44(fy.kstride._4_4_,(int)fy.kstride));
          fcy.begin.z = fy.begin.x;
          fcy.end.z = (int)((long)fy.end.x + 1);
          iVar7 = (int)srd_update_scale;
          fcy.ncomp = fy.end.z - iVar7;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&fcz,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&fx);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&ccc,local_ab0,(MFIter *)&fx,0);
          local_7a8[0] = local_798;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7a8,*(long *)redistribution_type._M_dataplus._M_p,
                     *(long *)(redistribution_type._M_dataplus._M_p + 8) +
                     *(long *)redistribution_type._M_dataplus._M_p);
          vfrac.kstride = 0;
          vfrac.nstride = 0;
          vfrac.p = (double *)0x0;
          vfrac.jstride = 0;
          vfrac.begin.x = 1;
          vfrac.begin.y = 1;
          vfrac.begin.z = 1;
          vfrac.end.x = 0;
          vfrac.end.y = 0;
          vfrac.end.z = 0;
          vfrac.ncomp = 0;
          redistribution_type_00._M_string_length._0_1_ = 2;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_7a8;
          redistribution_type_00._M_string_length._1_7_ = 0;
          redistribution_type_00.field_2._M_local_buf[0] = (char)&vfrac;
          redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)&vfrac >> 8);
          redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff488;
          Redistribution::Apply
                    ((Box *)&apx,iVar7,(Array4<double> *)&fcy,(Array4<double> *)&fcz,&ccc,
                     (Array4<double> *)&result,(Array4<const_amrex::EBCellFlag> *)&fz,
                     (Array4<const_double> *)&xed,(Array4<const_double> *)&yed,
                     (Array4<const_double> *)&zed,(Array4<const_double> *)&advc_arr,&fcx_1,&uc,&vc,
                     &wc,d_bcrec_ptr,geom,local_778,redistribution_type_00,
                     (int)in_stack_fffffffffffff490,0.5,srd_update_scale);
          if (local_7a8[0] != local_798) {
            operator_delete(local_7a8[0],local_798[0] + 1);
          }
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&fcz,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&fx,
                     aofs_comp);
          if (0 < iVar7) {
            lVar9 = (long)apx.p._4_4_;
            in_stack_fffffffffffff490 =
                 (lVar9 - fcz.begin.y) * fcz.jstride * 8 + (long)(int)apx.p * 8 +
                 (long)fcz.begin.x * -8 + (long)fcz.p;
            lVar20 = (lVar9 - fcy.begin.y) * fcy.jstride * 8 + (long)(int)apx.p * 8 +
                     (long)fcy.begin.x * -8 + (long)fcy.p;
            uVar25 = 0;
            do {
              iVar7 = (int)apx.jstride;
              if ((int)apx.jstride <= apx.kstride._4_4_) {
                do {
                  if (apx.p._4_4_ <= (int)apx.kstride) {
                    lVar21 = ((long)iVar7 - (long)fcz.begin.z) * fcz.kstride * 8 +
                             in_stack_fffffffffffff490;
                    lVar19 = ((long)iVar7 - (long)fcy.begin.z) * fcy.kstride * 8 + lVar20;
                    lVar23 = lVar9;
                    do {
                      if ((int)apx.p <= apx.jstride._4_4_) {
                        lVar27 = 0;
                        do {
                          *(double *)(lVar21 + lVar27 * 8) =
                               *(double *)(lVar21 + lVar27 * 8) - *(double *)(lVar19 + lVar27 * 8);
                          lVar27 = lVar27 + 1;
                        } while ((apx.jstride._4_4_ - (int)apx.p) + 1 != (int)lVar27);
                      }
                      lVar23 = lVar23 + 1;
                      lVar21 = lVar21 + fcz.jstride * 8;
                      lVar19 = lVar19 + fcy.jstride * 8;
                    } while ((int)apx.kstride + 1 != (int)lVar23);
                  }
                  bVar28 = iVar7 != apx.kstride._4_4_;
                  iVar7 = iVar7 + 1;
                } while (bVar28);
              }
              uVar25 = uVar25 + 1;
              in_stack_fffffffffffff490 = in_stack_fffffffffffff490 + fcz.nstride * 8;
              lVar20 = lVar20 + fcy.nstride * 8;
            } while (uVar25 != uVar11);
          }
          amrex::Gpu::Elixir::~Elixir((Elixir *)&apz);
          fy.p = (double *)&PTR__BaseFab_0080bbd8;
          amrex::BaseFab<double>::clear((BaseFab<double> *)&fy);
        }
      }
      amrex::MFIter::operator++((MFIter *)&fx);
    } while (fx.begin.x < fx.begin.z);
  }
  amrex::MFIter::~MFIter((MFIter *)&fx);
  amrex::MultiFab::~MultiFab(&sstate_tmp);
  amrex::MultiFab::~MultiFab(&advc);
  return;
}

Assistant:

void
EBMOL::ComputeSyncAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                         MultiFab const& state, int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab const& ucorr,
                                       MultiFab const& vcorr,
                                       MultiFab const& wcorr),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         int  edge_comp,
                         bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         Vector<BCRec> const& bcs,
                         BCRec  const* d_bcrec_ptr,
                         Geometry const&  geom,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type )
{
    BL_PROFILE("EBMOL::ComputeSyncAofs()");

    bool fluxes_are_area_weighted = true;

    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););


    // To compute edge states, need at least 2 ghost cells in state
    if ( !known_edgestate )
        AMREX_ALWAYS_ASSERT(state.nGrow() >= 2);

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());
    auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());

    // Need 2 grow cells in state to compute the slopes needed to compute the edge state.
    int halo = known_edgestate ? 0 : 2;

    // Create temporary holder for advection term. Needed to fill ghost cells.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfactory);
    advc.setVal(0.);

    Box  const& domain = geom.Domain();
    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();
    AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
                      const Box& ybx = mfi.nodaltilebox(1);,
                      const Box& zbx = mfi.nodaltilebox(2); );

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

    AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        // Initialize covered cells
        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) == FabType::covered)
        {
            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
            AMREX_D_TERM( Array4<Real const> uc = ucorr.const_array(mfi);,
                          Array4<Real const> vc = vcorr.const_array(mfi);,
                          Array4<Real const> wc = wcorr.const_array(mfi););

        Array4<Real> advc_arr = advc.array(mfi);

            bool regular = flagfab.getType(amrex::grow(bx,halo)) == FabType::regular;

            if (!regular)
            {
                AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

                Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);

                auto vfrac = ebfactory.getVolFrac().const_array(mfi);

                AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    EBMOL::ComputeEdgeState( bx,
                                             AMREX_D_DECL(xed,yed,zed),
                                             q, ncomp,
                                             AMREX_D_DECL(u,v,w),
                                             domain, bcs, d_bcrec_ptr,
                                             AMREX_D_DECL(fcx,fcy,fcz),
                                             ccc, vfrac, flag,
                                             is_velocity );
                }

                // Compute fluxes
                HydroUtils::EB_ComputeFluxes(bx,
                                             AMREX_D_DECL(fx,fy,fz),
                                             AMREX_D_DECL(uc,vc,wc),
                                             AMREX_D_DECL(xed,yed,zed),
                                             AMREX_D_DECL(apx,apy,apz),
                                             geom, ncomp, flag, fluxes_are_area_weighted  );

                // Compute divergence
        // Compute -div because that's what redistribution needs
                Real mult = -1.0;
                HydroUtils::EB_ComputeDivergence(bx, advc_arr,
                                                 AMREX_D_DECL(fx,fy,fz), vfrac,
                                                 ncomp, geom, mult, fluxes_are_area_weighted  );
            }
            else
            {
                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    MOL::ComputeEdgeState( bx,
                                           AMREX_D_DECL( xed, yed, zed ),
                                           q, ncomp,
                                           AMREX_D_DECL( u, v, w ),
                                           domain, bcs, d_bcrec_ptr,
                                           is_velocity);

                }

                // Compute fluxes
                HydroUtils::ComputeFluxes(bx,
                                          AMREX_D_DECL(fx,fy,fz),
                                          AMREX_D_DECL(uc,vc,wc),
                                          AMREX_D_DECL(xed,yed,zed),
                                          geom, ncomp, fluxes_are_area_weighted  );

                // Compute divergence
                // We use minus sign, i.e. -div, for consistency with EB above
                Real mult = -1.0;
                HydroUtils::ComputeDivergence(bx, advc_arr,
                                              AMREX_D_DECL(fx,fy,fz),
                                              ncomp, geom,
                                              mult, fluxes_are_area_weighted );
            }
    }
    }

    advc.FillBoundary(geom.periodicity());

    MultiFab sstate_tmp;
    MultiFab* sstate;
    if (redistribution_type == "StateRedist")
    {
      // Create temporary holder for sync "state" passed in via aofs
      // Do this so we're not overwriting the "state" as we go through the redistribution
      // process.
      sstate_tmp.define(state.boxArray(),state.DistributionMap(),ncomp,state.nGrow(),
                        MFInfo(),ebfactory);
      sstate = &sstate_tmp;
      MultiFab::Copy(*sstate,aofs,aofs_comp,0,ncomp,state.nGrow());
    }
    else
    {
      // Doesn't matter what we put here, sstate only gets used for StateRedist
      sstate = &aofs;
    }

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) != FabType::covered)
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
        auto vfrac = ebfactory.getVolFrac().const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);
        FArrayBox tmpfab(gbx, ncomp*2);
        Elixir eli = tmpfab.elixir();
        Array4<Real> scratch = tmpfab.array(0);
        if (redistribution_type == "FluxRedist")
        {
          amrex::ParallelFor(Box(scratch),
              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
              { scratch(i,j,k) = 1.;});
        }
        Array4<Real> divtmp_redist_arr = tmpfab.array(ncomp);

        // Redistribute
        //
        // For StateRedistribution, we use the Sync as the "state".
        // This may lead to oversmoothing.
        //
        Redistribution::Apply( bx, ncomp,  divtmp_redist_arr, advc.array(mfi),
                   sstate->const_array(mfi, 0), scratch, flag,
                   AMREX_D_DECL(apx,apy,apz), vfrac,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bcrec_ptr,
                   geom, dt, redistribution_type );

        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed by EB_ComputeDivergence, thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_redist_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -=  divtmp_redist_arr( i, j, k, n ); });
      }
      else
      {
        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed here, and thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);
        Array4<Real> advc_arr = advc.array(mfi);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -= advc_arr( i, j, k, n ); });
      }
    }
    }
}